

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O3

void FIX::HttpServer::stopGlobal(void)

{
  undefined4 uVar1;
  long *plVar2;
  long *plVar3;
  
  Mutex::lock((Mutex *)s_mutex);
  plVar2 = s_pServer;
  s_count = s_count + -1;
  if (s_pServer == (long *)0x0 || s_count != 0) goto LAB_0017f260;
  plVar3 = plVar2;
  if (*(char *)((long)s_pServer + 0xac) == '\0') {
    *(undefined1 *)((long)s_pServer + 0xac) = 1;
    if (plVar2[0x14] == 0) goto LAB_0017f250;
    thread_join(plVar2[0x14]);
    plVar3 = s_pServer;
    plVar2[0x14] = 0;
    if (plVar3 != (long *)0x0) goto LAB_0017f250;
  }
  else {
LAB_0017f250:
    (**(code **)(*plVar3 + 8))(plVar3);
  }
  s_pServer = (long *)0x0;
LAB_0017f260:
  uVar1 = s_mutex._48_4_;
  s_mutex._48_4_ = s_mutex._48_4_ + -1;
  if (1 < (int)uVar1) {
    return;
  }
  s_mutex._40_8_ = 0;
  pthread_mutex_unlock((pthread_mutex_t *)s_mutex);
  return;
}

Assistant:

void HttpServer::stop()
{
  if( m_stop ) return;
  m_stop = true;
  onStop();

  if( m_threadid )
    thread_join( m_threadid );
  m_threadid = 0;
}